

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cComputeShaderTests.cpp
# Opt level: O2

long __thiscall gl4cts::anon_unknown_0::BasicSharedSimple::Run(BasicSharedSimple *this)

{
  bool bVar1;
  GLuint GVar2;
  bool *compile_error;
  long lVar3;
  allocator<char> local_31;
  string local_30;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,
             "\nlayout(local_size_x = 256) in;\nlayout(std430) buffer Output {\n  uint g_output[];\n};\nshared uint g_shared_data[256];\nvoid main() {\n  g_shared_data[gl_LocalInvocationID.x] = gl_LocalInvocationIndex;\n  groupMemoryBarrier();\n  barrier();\n  g_output[gl_GlobalInvocationID.x] = 1;\n  if (gl_LocalInvocationIndex < 255) {\n    const uint res = g_shared_data[gl_LocalInvocationID.x + 1];\n    if (res != (gl_LocalInvocationIndex + 1)) {\n      g_output[gl_GlobalInvocationID.x] = 0;\n    }\n  }\n}"
             ,&local_31);
  GVar2 = ComputeShaderBase::CreateComputeProgram(&this->super_ComputeShaderBase,&local_30);
  this->m_program = GVar2;
  std::__cxx11::string::~string((string *)&local_30);
  glu::CallLogWrapper::glLinkProgram
            (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper
             ,this->m_program);
  bVar1 = ComputeShaderBase::CheckProgram
                    (&this->super_ComputeShaderBase,this->m_program,compile_error);
  lVar3 = -1;
  if (bVar1) {
    bVar1 = RunIteration(this,1,false);
    if (bVar1) {
      bVar1 = RunIteration(this,8,true);
      if (bVar1) {
        bVar1 = RunIteration(this,0xd,false);
        if (bVar1) {
          bVar1 = RunIteration(this,7,true);
          lVar3 = (ulong)bVar1 - 1;
        }
      }
    }
  }
  return lVar3;
}

Assistant:

virtual long Run()
	{
		const char* const glsl_cs =
			NL "layout(local_size_x = 256) in;" NL "layout(std430) buffer Output {" NL "  uint g_output[];" NL "};" NL
			   "shared uint g_shared_data[256];" NL "void main() {" NL
			   "  g_shared_data[gl_LocalInvocationID.x] = gl_LocalInvocationIndex;" NL
			   "  groupMemoryBarrier();" // flush memory stores
			NL "  barrier();"			 // wait for all stores to finish
			NL "  g_output[gl_GlobalInvocationID.x] = 1;" NL "  if (gl_LocalInvocationIndex < 255) {" NL
			   "    const uint res = g_shared_data[gl_LocalInvocationID.x + "
			   "1];" // load data from shared memory filled by other thread
			NL "    if (res != (gl_LocalInvocationIndex + 1)) {" NL "      g_output[gl_GlobalInvocationID.x] = 0;" NL
			   "    }" NL "  }" NL "}";
		m_program = CreateComputeProgram(glsl_cs);
		glLinkProgram(m_program);
		if (!CheckProgram(m_program))
			return ERROR;

		if (!RunIteration(1, false))
			return ERROR;
		if (!RunIteration(8, true))
			return ERROR;
		if (!RunIteration(13, false))
			return ERROR;
		if (!RunIteration(7, true))
			return ERROR;
		return NO_ERROR;
	}